

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

Path * __thiscall
Map<int,_Path,_std::less<int>_>::value
          (Path *__return_storage_ptr__,Map<int,_Path,_std::less<int>_> *this,int *key,
          Path *defaultValue,bool *ok)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  bool *ok_local;
  Path *defaultValue_local;
  int *key_local;
  Map<int,_Path,_std::less<int>_> *this_local;
  
  it._M_node = (_Base_ptr)ok;
  local_38._M_node =
       (_Base_ptr)
       std::map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>::find
                 (&this->
                   super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
                  ,key);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>::end
                 (&this->
                   super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
                 );
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    if (it._M_node != (_Base_ptr)0x0) {
      *(undefined1 *)&(it._M_node)->_M_color = _S_red;
    }
    Path::Path(__return_storage_ptr__,defaultValue);
  }
  else {
    if (it._M_node != (_Base_ptr)0x0) {
      *(undefined1 *)&(it._M_node)->_M_color = _S_black;
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_Path>_>::operator->(&local_38);
    Path::Path(__return_storage_ptr__,&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

Value value(const Key &key, const Value &defaultValue, bool *ok = 0) const
    {
        typename Base::const_iterator it = Base::find(key);
        if (it == Base::end()) {
            if (ok)
                *ok = false;
            return defaultValue;
        }
        if (ok)
            *ok = true;
        return it->second;
    }